

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall
DependencyScan::RecomputeDirty
          (DependencyScan *this,Node *initial_node,
          vector<Node_*,_std::allocator<Node_*>_> *validation_nodes,string *err)

{
  Node *node;
  _Elt_pointer ppNVar1;
  _Elt_pointer ppNVar2;
  bool bVar3;
  vector<Node_*,_std::allocator<Node_*>_> new_validation_nodes;
  vector<Node_*,_std::allocator<Node_*>_> stack;
  deque<Node_*,_std::allocator<Node_*>_> nodes;
  vector<Node_*,_std::allocator<Node_*>_> local_108;
  vector<Node_*,_std::allocator<Node_*>_> local_e8;
  _Deque_base<Node_*,_std::allocator<Node_*>_> local_c8;
  Node *local_78;
  const_iterator local_70;
  iterator local_50;
  
  local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (Node **)0x0;
  local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_78 = initial_node;
  std::deque<Node_*,_std::allocator<Node_*>_>::deque
            ((deque<Node_*,_std::allocator<Node_*>_> *)&local_c8,1,&local_78,
             (allocator_type *)&local_50);
  do {
    ppNVar2 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppNVar1 = local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    node = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    if (local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    bVar3 = RecomputeNodeDirty(this,node,&local_e8,&local_108,err);
    if (!bVar3) break;
    local_70._M_cur = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_70._M_first = local_c8._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_70._M_last = local_c8._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_70._M_node = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::deque<Node*,std::allocator<Node*>>::
    insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,void>
              (&local_50,(deque<Node*,std::allocator<Node*>> *)&local_c8,&local_70,
               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
               local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
               local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (validation_nodes == (vector<Node_*,_std::allocator<Node_*>_> *)0x0) {
        __assert_fail("validation_nodes && \"validations require RecomputeDirty to be called with validation_nodes\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc"
                      ,0x49,
                      "bool DependencyScan::RecomputeDirty(Node *, std::vector<Node *> *, string *)"
                     );
      }
      std::vector<Node*,std::allocator<Node*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>>
                ((vector<Node*,std::allocator<Node*>> *)validation_nodes,
                 (validation_nodes->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  } while (bVar3);
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_c8);
  if (local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (Node **)0x0) {
    operator_delete(local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ppNVar2 == ppNVar1;
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* initial_node,
                                    std::vector<Node*>* validation_nodes,
                                    string* err) {
  std::vector<Node*> stack;
  std::vector<Node*> new_validation_nodes;

  std::deque<Node*> nodes(1, initial_node);

  // RecomputeNodeDirty might return new validation nodes that need to be
  // checked for dirty state, keep a queue of nodes to visit.
  while (!nodes.empty()) {
    Node* node = nodes.front();
    nodes.pop_front();

    stack.clear();
    new_validation_nodes.clear();

    if (!RecomputeNodeDirty(node, &stack, &new_validation_nodes, err))
      return false;
    nodes.insert(nodes.end(), new_validation_nodes.begin(),
                              new_validation_nodes.end());
    if (!new_validation_nodes.empty()) {
      assert(validation_nodes &&
          "validations require RecomputeDirty to be called with validation_nodes");
      validation_nodes->insert(validation_nodes->end(),
                           new_validation_nodes.begin(),
                           new_validation_nodes.end());
    }
  }

  return true;
}